

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

void Scl_LibertyWipeOutComments(char *pBeg,char *pEnd)

{
  char *pcVar1;
  char *pcVar2;
  char *pCur;
  
  pcVar1 = pEnd + -1;
LAB_003511d4:
  if (pcVar1 <= pBeg) {
    return;
  }
  pcVar2 = pBeg;
  if (*pBeg == '/') {
    if (pBeg[1] == '*') {
LAB_00351206:
      if (pcVar2 < pcVar1) {
        if ((*pcVar2 != '*') || (pcVar2[1] != '/')) goto LAB_00351203;
        for (; pBeg < pcVar2 + 2; pBeg = pBeg + 1) {
          if (*pBeg != '\n') {
            *pBeg = ' ';
          }
        }
      }
      goto LAB_0035123a;
    }
    if (pBeg[1] == '/') {
      for (; pcVar2 < pEnd; pcVar2 = pcVar2 + 1) {
        if ((pcVar2 == pcVar1) || (*pcVar2 == '\n')) goto LAB_00351232;
      }
    }
  }
  goto LAB_0035123a;
LAB_00351203:
  pcVar2 = pcVar2 + 1;
  goto LAB_00351206;
LAB_00351232:
  for (; pBeg < pcVar2; pBeg = pBeg + 1) {
    *pBeg = ' ';
  }
LAB_0035123a:
  pBeg = pcVar2 + 1;
  goto LAB_003511d4;
}

Assistant:

void Scl_LibertyWipeOutComments( char * pBeg, char * pEnd )
{
    char * pCur, * pStart;
    for ( pCur = pBeg; pCur < pEnd-1; pCur++ )
        if ( pCur[0] == '/' && pCur[1] == '*' )
        {
            for ( pStart = pCur; pCur < pEnd-1; pCur++ )
                if ( pCur[0] == '*' && pCur[1] == '/' )
                {
                    for ( ; pStart < pCur + 2; pStart++ )
                    if ( *pStart != '\n' ) *pStart = ' ';
                    break;
                }
        }
        else if ( pCur[0] == '/' && pCur[1] == '/' )
        {
            for ( pStart = pCur; pCur < pEnd; pCur++ )
                if ( pCur[0] == '\n' || pCur == pEnd-1 )
                {
                    for ( ; pStart < pCur; pStart++ ) *pStart = ' ';
                    break;
                }
        }
}